

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_1bacb1::allocatePixels
               (int type,Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *uintData,
               Array2D<float_*> *floatData,Array2D<Imath_3_2::half_*> *halfData,int width,int height
               )

{
  allocatePixels(type,sampleCount,uintData,floatData,halfData,0,width + -1,0,height + -1);
  return;
}

Assistant:

void
allocatePixels (
    int                     type,
    Array2D<unsigned int>&  sampleCount,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     width,
    int                     height)
{
    allocatePixels (
        type,
        sampleCount,
        uintData,
        floatData,
        halfData,
        0,
        width - 1,
        0,
        height - 1);
}